

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall
DLevelScript::DoFadeRange
          (DLevelScript *this,int r1,int g1,int b1,int a1,int r2,int g2,int b2,int a2,int time)

{
  bool bVar1;
  AActor *pAVar2;
  DFlashFader *this_00;
  APlayerPawn *who;
  float r2_00;
  float g2_00;
  float b2_00;
  int local_5c;
  int i;
  float fa2;
  float fb2;
  float fg2;
  float fr2;
  float fa1;
  float fb1;
  float fg1;
  float fr1;
  bool fadingFrom;
  player_t *ppStack_30;
  float ftime;
  player_t *viewer;
  int r2_local;
  int a1_local;
  int b1_local;
  int g1_local;
  int r1_local;
  DLevelScript *this_local;
  
  fb1 = 0.0;
  fa1 = 0.0;
  fr2 = 0.0;
  fg2 = 0.0;
  r2_00 = (float)r2 / 255.0;
  g2_00 = (float)g2 / 255.0;
  b2_00 = (float)b2 / 255.0;
  if (-1 < a1) {
    fb1 = (float)r1 / 255.0;
    fa1 = (float)g1 / 255.0;
    fr2 = (float)b1 / 255.0;
    fg2 = (float)a1 / 65536.0;
  }
  who = (APlayerPawn *)0x0;
  bVar1 = TObjPtr<AActor>::operator!=(&this->activator,(AActor *)0x0);
  if (bVar1) {
    pAVar2 = TObjPtr<AActor>::operator->(&this->activator);
    ppStack_30 = pAVar2->player;
    if (ppStack_30 != (player_t *)0x0) {
      local_5c = 8;
      goto LAB_0061ed7f;
    }
  }
  else {
    for (local_5c = 0; local_5c < 8; local_5c = local_5c + 1) {
      if ((playeringame[local_5c] & 1U) != 0) {
        ppStack_30 = (player_t *)(&players + (long)local_5c * 0x54);
LAB_0061ed7f:
        if (0.0 < (float)time / 65536.0) {
          if (-1 >= a1) {
            if (0.0 < ppStack_30->BlendA) {
              fb1 = ppStack_30->BlendR;
              fa1 = ppStack_30->BlendG;
              fr2 = ppStack_30->BlendB;
              fg2 = ppStack_30->BlendA;
            }
            else {
              fg2 = 0.0;
              fr2 = b2_00;
              fa1 = g2_00;
              fb1 = r2_00;
            }
          }
          this_00 = (DFlashFader *)DObject::operator_new((DObject *)0x68,(size_t)who);
          who = ppStack_30->mo;
          DFlashFader::DFlashFader
                    (this_00,fb1,fa1,fr2,fg2,r2_00,g2_00,b2_00,(float)a2 / 65536.0,
                     (float)time / 65536.0,&who->super_AActor);
        }
        else {
          ppStack_30->BlendR = r2_00;
          ppStack_30->BlendG = g2_00;
          ppStack_30->BlendB = b2_00;
          ppStack_30->BlendA = (float)a2 / 65536.0;
        }
      }
    }
  }
  return;
}

Assistant:

void DLevelScript::DoFadeRange (int r1, int g1, int b1, int a1,
								int r2, int g2, int b2, int a2, int time)
{
	player_t *viewer;
	float ftime = (float)time / 65536.f;
	bool fadingFrom = a1 >= 0;
	float fr1 = 0, fg1 = 0, fb1 = 0, fa1 = 0;
	float fr2, fg2, fb2, fa2;
	int i;

	fr2 = (float)r2 / 255.f;
	fg2 = (float)g2 / 255.f;
	fb2 = (float)b2 / 255.f;
	fa2 = (float)a2 / 65536.f;

	if (fadingFrom)
	{
		fr1 = (float)r1 / 255.f;
		fg1 = (float)g1 / 255.f;
		fb1 = (float)b1 / 255.f;
		fa1 = (float)a1 / 65536.f;
	}

	if (activator != NULL)
	{
		viewer = activator->player;
		if (viewer == NULL)
			return;
		i = MAXPLAYERS;
		goto showme;
	}
	else
	{
		for (i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i])
			{
				viewer = &players[i];
showme:
				if (ftime <= 0.f)
				{
					viewer->BlendR = fr2;
					viewer->BlendG = fg2;
					viewer->BlendB = fb2;
					viewer->BlendA = fa2;
				}
				else
				{
					if (!fadingFrom)
					{
						if (viewer->BlendA <= 0.f)
						{
							fr1 = fr2;
							fg1 = fg2;
							fb1 = fb2;
							fa1 = 0.f;
						}
						else
						{
							fr1 = viewer->BlendR;
							fg1 = viewer->BlendG;
							fb1 = viewer->BlendB;
							fa1 = viewer->BlendA;
						}
					}
					new DFlashFader (fr1, fg1, fb1, fa1, fr2, fg2, fb2, fa2, ftime, viewer->mo);
				}
			}
		}
	}
}